

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

nk_rect nk_layout_space_bounds(nk_context *ctx)

{
  undefined4 uVar1;
  undefined4 uVar2;
  nk_panel *pnVar3;
  nk_rect nVar4;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x4680,"struct nk_rect nk_layout_space_bounds(struct nk_context *)");
  }
  if (ctx->current != (nk_window *)0x0) {
    pnVar3 = ctx->current->layout;
    if (pnVar3 != (nk_panel *)0x0) {
      uVar1 = (pnVar3->clip).x;
      uVar2 = (pnVar3->clip).y;
      nVar4.y = (float)uVar2;
      nVar4.x = (float)uVar1;
      nVar4.h = (pnVar3->row).height;
      nVar4.w = (pnVar3->clip).w;
      return nVar4;
    }
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x4682,"struct nk_rect nk_layout_space_bounds(struct nk_context *)");
  }
  __assert_fail("ctx->current",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                ,0x4681,"struct nk_rect nk_layout_space_bounds(struct nk_context *)");
}

Assistant:

NK_API struct nk_rect
nk_layout_space_bounds(struct nk_context *ctx)
{
    struct nk_rect ret;
    struct nk_window *win;
    struct nk_panel *layout;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    win = ctx->current;
    layout = win->layout;

    ret.x = layout->clip.x;
    ret.y = layout->clip.y;
    ret.w = layout->clip.w;
    ret.h = layout->row.height;
    return ret;
}